

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O1

void gray_hline(gray_PWorker worker,TCoord x,TCoord y,TPos area,TCoord acount)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  SW_FT_Span *pSVar7;
  long lVar8;
  long lVar9;
  
  uVar4 = (uint)((ulong)area >> 9);
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if (((worker->outline).flags & 2) == 0) {
    uVar4 = 0xff;
    if ((int)uVar3 < 0xff) {
      uVar4 = uVar3;
    }
  }
  else {
    uVar3 = uVar3 & 0x1ff;
    if (uVar3 < 0x101) {
      uVar4 = 0xff;
      if (uVar3 != 0x100) {
        uVar4 = uVar3;
      }
    }
    else {
      uVar4 = 0x200 - uVar3;
    }
  }
  lVar5 = y + worker->min_ey;
  lVar9 = x + worker->min_ex;
  if (0x7ffe < lVar9) {
    lVar9 = 0x7fff;
  }
  lVar8 = 0x7fffffff;
  if (lVar5 < 0x7fffffff) {
    lVar8 = lVar5;
  }
  if (uVar4 != 0) {
    if (lVar9 < worker->bound_left) {
      worker->bound_left = (int)lVar9;
    }
    if (lVar5 < worker->bound_top) {
      worker->bound_top = (int)lVar8;
    }
    if (worker->bound_bottom < lVar8) {
      worker->bound_bottom = (int)lVar8;
    }
    if ((long)worker->bound_right < lVar9 + acount) {
      worker->bound_right = (int)(lVar9 + acount);
    }
    iVar2 = worker->num_gray_spans;
    lVar6 = (long)iVar2;
    pSVar7 = worker->gray_spans + lVar6;
    if ((((lVar6 < 1) || (lVar5 != worker->gray_spans[lVar6 + -1].y)) ||
        (uVar1 = worker->gray_spans[lVar6 + -1].len,
        (int)worker->gray_spans[lVar6 + -1].x + (uint)uVar1 != (int)lVar9)) ||
       (uVar4 != worker->gray_spans[lVar6 + -1].coverage)) {
      if (0xff < iVar2) {
        pSVar7 = worker->gray_spans;
        if (worker->render_span != (SW_FT_SpanFunc)0x0) {
          (*worker->render_span)(iVar2,pSVar7,worker->render_span_data);
        }
        worker->num_gray_spans = 0;
      }
      pSVar7->x = (short)lVar9;
      pSVar7->y = (short)lVar8;
      pSVar7->len = (unsigned_short)acount;
      pSVar7->coverage = (uchar)uVar4;
      worker->num_gray_spans = worker->num_gray_spans + 1;
    }
    else {
      worker->gray_spans[lVar6 + -1].len = uVar1 + (unsigned_short)acount;
    }
  }
  return;
}

Assistant:

static void gray_hline(RAS_ARG_ TCoord x, TCoord y, TPos area, TCoord acount)
{
    int coverage;

    /* compute the coverage line's coverage, depending on the    */
    /* outline fill rule                                         */
    /*                                                           */
    /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
    /*                                                           */
    coverage = (int)(area >> (PIXEL_BITS * 2 + 1 - 8));
    /* use range 0..256 */
    if (coverage < 0) coverage = -coverage;

    if (ras.outline.flags & SW_FT_OUTLINE_EVEN_ODD_FILL) {
        coverage &= 511;

        if (coverage > 256)
            coverage = 512 - coverage;
        else if (coverage == 256)
            coverage = 255;
    } else {
        /* normal non-zero winding rule */
        if (coverage >= 256) coverage = 255;
    }

    y += (TCoord)ras.min_ey;
    x += (TCoord)ras.min_ex;

    /* SW_FT_Span.x is a 16-bit short, so limit our coordinates appropriately */
    if (x >= 32767) x = 32767;

    /* SW_FT_Span.y is an integer, so limit our coordinates appropriately */
    if (y >= SW_FT_INT_MAX) y = SW_FT_INT_MAX;

    if (coverage) {
        SW_FT_Span* span;
        int         count;

        // update bounding box.
        if (x < ras.bound_left) ras.bound_left = x;
        if (y < ras.bound_top) ras.bound_top = y;
        if (y > ras.bound_bottom) ras.bound_bottom = y;
        if (x + acount > ras.bound_right) ras.bound_right = x + acount;

        /* see whether we can add this span to the current list */
        count = ras.num_gray_spans;
        span = ras.gray_spans + count - 1;
        if (count > 0 && span->y == y && (int)span->x + span->len == (int)x &&
            span->coverage == coverage) {
            span->len = (unsigned short)(span->len + acount);
            return;
        }

        if (count >= SW_FT_MAX_GRAY_SPANS) {
            if (ras.render_span && count > 0)
                ras.render_span(count, ras.gray_spans, ras.render_span_data);

#ifdef DEBUG_GRAYS

            if (1) {
                int n;

                fprintf(stderr, "count = %3d ", count);
                span = ras.gray_spans;
                for (n = 0; n < count; n++, span++)
                    fprintf(stderr, "[%d , %d..%d] : %d ", span->y, span->x,
                            span->x + span->len - 1, span->coverage);
                fprintf(stderr, "\n");
            }

#endif /* DEBUG_GRAYS */

            ras.num_gray_spans = 0;

            span = ras.gray_spans;
        } else
            span++;

        /* add a gray span to the current list */
        span->x = (short)x;
        span->y = (short)y;
        span->len = (unsigned short)acount;
        span->coverage = (unsigned char)coverage;

        ras.num_gray_spans++;
    }
}